

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O2

CAddr __thiscall cppforth::Forth::setVirtualMemory(Forth *this,string *value,int segmentName)

{
  Cell CVar1;
  int iVar2;
  int iVar3;
  char *__first;
  reference pvVar4;
  vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
  *this_00;
  size_type __n;
  
  this_00 = &this->VirtualMemory;
  __n = (size_type)segmentName;
  pvVar4 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(this_00,__n);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&pvVar4->segment,0);
  __first = (value->_M_dataplus)._M_p;
  std::__copy_move<false,false,std::random_access_iterator_tag>::
  __copy_m<char_const*,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (__first,__first + value->_M_string_length,
             (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>)
             &pvVar4->segment);
  pvVar4 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(this_00,__n);
  CVar1 = pvVar4->start;
  pvVar4 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(this_00,__n);
  iVar2 = *(int *)&(pvVar4->segment).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
  iVar3 = *(int *)&(pvVar4->segment).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
  pvVar4 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(this_00,__n);
  pvVar4->end = (iVar2 - iVar3) + CVar1;
  pvVar4 = std::
           vector<cppforth::Forth::VirtualMemorySegment,_std::allocator<cppforth::Forth::VirtualMemorySegment>_>
           ::at(this_00,__n);
  return pvVar4->start;
}

Assistant:

CAddr setVirtualMemory(const std::string &value, int segmentName){
			auto &sourceBufferVirtual = VirtualMemory.at(segmentName).segment;
			sourceBufferVirtual.resize(0);
			std::copy(value.begin(), value.end(), std::back_inserter(sourceBufferVirtual));
			VirtualMemory.at(segmentName).end = VirtualMemory.at(segmentName).start + 
				static_cast<Cell>(VirtualMemory.at(segmentName).segment.size());
			return VirtualMemory.at(segmentName).start ;
		}